

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_new_std_file(JSContext *ctx,FILE *f,BOOL close_in_finalizer,BOOL is_popen)

{
  int iVar1;
  JSValueUnion JVar2;
  undefined8 *opaque;
  ulong uVar3;
  JSValue v;
  JSValue JVar4;
  
  v = JS_NewObjectClass(ctx,js_std_file_class_id);
  JVar2 = v.u;
  if ((uint)v.tag != 6) {
    opaque = (undefined8 *)js_mallocz(ctx,0x10);
    if (opaque == (undefined8 *)0x0) {
      if ((0xfffffff4 < (uint)v.tag) &&
         (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValue(ctx,v);
      }
      v = (JSValue)(ZEXT816(6) << 0x40);
      uVar3 = 0;
      goto LAB_00110814;
    }
    *(BOOL *)(opaque + 1) = close_in_finalizer;
    *(BOOL *)((long)opaque + 0xc) = is_popen;
    *opaque = f;
    JS_SetOpaque(v,opaque);
  }
  uVar3 = (ulong)JVar2.ptr & 0xffffffff00000000;
LAB_00110814:
  JVar4.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar3);
  JVar4.tag = v.tag;
  return JVar4;
}

Assistant:

static JSValue js_new_std_file(JSContext *ctx, FILE *f,
                               BOOL close_in_finalizer,
                               BOOL is_popen)
{
    JSSTDFile *s;
    JSValue obj;
    obj = JS_NewObjectClass(ctx, js_std_file_class_id);
    if (JS_IsException(obj))
        return obj;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    s->close_in_finalizer = close_in_finalizer;
    s->is_popen = is_popen;
    s->f = f;
    JS_SetOpaque(obj, s);
    return obj;
}